

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remotefile.c
# Opt level: O0

apx_size_t rmf_address_decode(uint8_t *begin,uint8_t *end,uint32_t *address,_Bool *more_bit)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t value_1;
  uint32_t value;
  uint8_t first_byte;
  apx_size_t retval;
  _Bool *more_bit_local;
  uint32_t *address_local;
  uint8_t *end_local;
  uint8_t *begin_local;
  
  value = 0;
  if ((((begin == (uint8_t *)0x0) || (end == (uint8_t *)0x0)) || (address == (uint32_t *)0x0)) ||
     ((more_bit == (_Bool *)0x0 || (end <= begin)))) {
    begin_local._4_4_ = 0;
  }
  else {
    bVar1 = *begin;
    *more_bit = (bVar1 & 0x40) != 0;
    if ((bVar1 & 0x80) == 0) {
      if (begin + 2 <= end) {
        uVar2 = unpackBE(begin,'\x02');
        *address = uVar2 & 0x3fff;
        value = 2;
      }
    }
    else if (begin + 4 <= end) {
      uVar2 = unpackBE(begin,'\x04');
      *address = uVar2 & 0x3fffffff;
      value = 4;
    }
    begin_local._4_4_ = value;
  }
  return begin_local._4_4_;
}

Assistant:

apx_size_t rmf_address_decode(uint8_t const* begin, uint8_t const* end, uint32_t* address, bool* more_bit)
{
   apx_size_t retval = 0u;
   if ((begin == NULL) || (end == NULL) || (address == NULL) || (more_bit == NULL) || (begin >= end))
   {
      return 0u; //Invalid argument
   }
   uint8_t const first_byte = *begin;
   *more_bit = (first_byte & RMF_U8_MORE_BIT) ? true : false;
   if (first_byte & RMF_U8_HIGH_ADDR_BIT)
   {
      if (begin +  UINT32_SIZE <= end)
      {
         uint32_t value = unpackBE(begin, (uint8_t) UINT32_SIZE);
         *address = value & RMF_HIGH_ADDR_MASK;
         retval = UINT32_SIZE;
      }
   }
   else
   {
      if (begin + UINT16_SIZE <= end)
      {
         uint32_t value = unpackBE(begin, UINT16_SIZE);
         *address = (value & RMF_LOW_ADDR_MASK);
         retval = UINT16_SIZE;
      }
   }
   return retval;
}